

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigScl.c
# Opt level: O1

int Aig_ManReduceLachesCount(Aig_Man_t *p)

{
  ulong *puVar1;
  void *pvVar2;
  ulong uVar3;
  int iVar4;
  uint uVar5;
  long lVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  Vec_Ptr_t *pVVar10;
  ulong uVar11;
  
  if (p->nRegs < 1) {
    __assert_fail("Aig_ManRegNum(p) > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aigScl.c"
                  ,0x15f,"int Aig_ManReduceLachesCount(Aig_Man_t *)");
  }
  lVar6 = (long)p->vObjs->nSize;
  if (0 < lVar6) {
    lVar8 = 0;
    do {
      pvVar2 = p->vObjs->pArray[lVar8];
      if ((pvVar2 != (void *)0x0) && ((*(byte *)((long)pvVar2 + 0x18) & 0x30) != 0)) {
        __assert_fail("!pObj->fMarkA && !pObj->fMarkB",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aigScl.c"
                      ,0x161,"int Aig_ManReduceLachesCount(Aig_Man_t *)");
      }
      lVar8 = lVar8 + 1;
    } while (lVar6 != lVar8);
  }
  uVar5 = p->nObjs[3] - p->nRegs;
  pVVar10 = p->vCos;
  iVar4 = 0;
  if ((int)uVar5 < pVVar10->nSize) {
    uVar7 = (ulong)uVar5;
    iVar4 = 0;
    do {
      if ((int)uVar5 < 0) goto LAB_0063e9a2;
      uVar3 = *(ulong *)((long)pVVar10->pArray[uVar7] + 8);
      uVar9 = uVar3 & 0xfffffffffffffffe;
      uVar11 = *(ulong *)(uVar9 + 0x18);
      if ((uVar3 & 1) == 0) {
        if ((uVar11 & 0x10) == 0) {
          uVar11 = uVar11 | 0x10;
          goto LAB_0063e953;
        }
LAB_0063e959:
        iVar4 = iVar4 + 1;
      }
      else {
        if ((uVar11 & 0x20) != 0) goto LAB_0063e959;
        uVar11 = uVar11 | 0x20;
LAB_0063e953:
        *(ulong *)(uVar9 + 0x18) = uVar11;
      }
      uVar7 = uVar7 + 1;
      pVVar10 = p->vCos;
    } while ((int)uVar7 < pVVar10->nSize);
  }
  uVar5 = p->nObjs[3] - p->nRegs;
  pVVar10 = p->vCos;
  if ((int)uVar5 < pVVar10->nSize) {
    uVar7 = (ulong)uVar5;
    do {
      if ((int)uVar5 < 0) {
LAB_0063e9a2:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      puVar1 = (ulong *)((*(ulong *)((long)pVVar10->pArray[uVar7] + 8) & 0xfffffffffffffffe) + 0x18)
      ;
      *puVar1 = *puVar1 & 0xffffffffffffffcf;
      uVar7 = uVar7 + 1;
      pVVar10 = p->vCos;
    } while ((int)uVar7 < pVVar10->nSize);
  }
  return iVar4;
}

Assistant:

int Aig_ManReduceLachesCount( Aig_Man_t * p )
{
    Aig_Obj_t * pObj, * pFanin;
    int i, Counter = 0, Diffs = 0;
    assert( Aig_ManRegNum(p) > 0 );
    Aig_ManForEachObj( p, pObj, i )
        assert( !pObj->fMarkA && !pObj->fMarkB );
    Aig_ManForEachLiSeq( p, pObj, i )
    {
        pFanin = Aig_ObjFanin0(pObj);
        if ( Aig_ObjFaninC0(pObj) )
        {
            if ( pFanin->fMarkB )
                Counter++;
            else
                pFanin->fMarkB = 1;
        }
        else
        {
            if ( pFanin->fMarkA )
                Counter++;
            else
                pFanin->fMarkA = 1;
        }
    }
    // count fanins that have both attributes
    Aig_ManForEachLiSeq( p, pObj, i )
    {
        pFanin = Aig_ObjFanin0(pObj);
        Diffs += pFanin->fMarkA && pFanin->fMarkB;
        pFanin->fMarkA = pFanin->fMarkB = 0;
    }
//    printf( "Diffs = %d.\n", Diffs );
    return Counter;
}